

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

void __thiscall gpu::shared_device_buffer::decref(shared_device_buffer *this)

{
  long *plVar1;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  long local_18;
  longlong count;
  shared_device_buffer *this_local;
  
  if (this->buffer_ != (uchar *)0x0) {
    plVar1 = (long *)this->buffer_;
    LOCK();
    local_18 = *plVar1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    local_18 = local_18 + -1;
    if (local_18 == 0) {
      count = (longlong)this;
      if (this->type_ == 1) {
        clReleaseMemObject((cl_mem)this->data_);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                   ,&local_39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"No GPU context!",&local_71);
        raiseException(&local_38,0x6a,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
      }
      if (this->buffer_ != (uchar *)0x0) {
        operator_delete__(this->buffer_);
      }
    }
    this->buffer_ = (uchar *)0x0;
    this->data_ = (void *)0x0;
    this->type_ = 0;
    this->size_ = 0;
    this->offset_ = 0;
  }
  return;
}

Assistant:

void shared_device_buffer::decref()
{
	if (!buffer_)
		return;

	long long count = 0;

#if defined(_WIN64)
	count = InterlockedDecrement64((LONGLONG *) buffer_);
#elif defined(_WIN32)
	count = InterlockedDecrement((LONG *) buffer_);
#else
	count = __sync_sub_and_fetch((long long *) buffer_, 1);
#endif

	if (!count) {
		switch (type_) {
#ifdef CUDA_SUPPORT
		case Context::TypeCUDA:
			cudaFree(data_);
			break;
#endif
		case Context::TypeOpenCL:
			clReleaseMemObject((cl_mem) data_);
			break;
		default:
			gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
		}

		delete [] buffer_;
	}

	buffer_ = 0;
	data_	= 0;
	type_	= Context::TypeUndefined;
	size_	= 0;
	offset_	= 0;
}